

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

void Hop_ConeCleanAndMark_rec(Hop_Obj_t *pObj)

{
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                  ,0xd4,"void Hop_ConeCleanAndMark_rec(Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 4) {
    Hop_ConeCleanAndMark_rec((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Hop_ConeCleanAndMark_rec((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                    ,0xd9,"void Hop_ConeCleanAndMark_rec(Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
    (pObj->field_0).pData = (void *)0x0;
  }
  return;
}

Assistant:

void Hop_ConeCleanAndMark_rec( Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Hop_ConeCleanAndMark_rec( Hop_ObjFanin0(pObj) );
    Hop_ConeCleanAndMark_rec( Hop_ObjFanin1(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
    pObj->pData = NULL;
}